

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

void intern_push_heap(uint64_t **first,size_t holeIndex,size_t topIndex,uint64_t *value)

{
  int iVar1;
  uint64_t *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  bool bVar2;
  size_t parent;
  undefined8 local_28;
  undefined8 local_10;
  
  local_28 = in_RSI - 1;
  local_10 = in_RSI;
  while( true ) {
    local_28 = local_28 >> 1;
    bVar2 = false;
    if (in_RDX < local_10) {
      iVar1 = FHeapCompare(*(uint64_t **)(in_RDI + local_28 * 8),in_RCX);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    *(undefined8 *)(in_RDI + local_10 * 8) = *(undefined8 *)(in_RDI + local_28 * 8);
    local_10 = local_28;
    local_28 = local_28 - 1;
  }
  *(uint64_t **)(in_RDI + local_10 * 8) = in_RCX;
  return;
}

Assistant:

static inline void
intern_push_heap (
    uint64_t** first, size_t holeIndex, size_t topIndex, uint64_t* value)
{
    size_t parent = (holeIndex - 1) / 2;
    while (holeIndex > topIndex && FHeapCompare (*(first + parent), value))
    {
        *(first + holeIndex) = *(first + parent);
        holeIndex            = parent;
        parent               = (holeIndex - 1) / 2;
    }
    *(first + holeIndex) = value;
}